

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrWorldMeshGetInfoML *value)

{
  pointer *this;
  pointer *this_00;
  ValidateXrFlagsResult VVar1;
  XrResult XVar2;
  allocator local_4e1;
  string local_4e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4c0;
  allocator local_4a1;
  string local_4a0 [32];
  uint local_480;
  allocator local_479;
  uint32_t value_blocks_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_458;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f0;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_390;
  allocator local_371;
  string local_370 [32];
  string local_350 [32];
  ostringstream local_330 [8];
  ostringstream oss_enum;
  allocator local_1b1;
  ValidateXrFlagsResult world_mesh_detector_flags_ml_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrWorldMeshGetInfoML *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_WORLD_MESH_GET_INFO_ML) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrWorldMeshGetInfoML",value->type,
               "VUID-XrWorldMeshGetInfoML-type-type",XR_TYPE_WORLD_MESH_GET_INFO_ML,
               "XR_TYPE_WORLD_MESH_GET_INFO_ML");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"VUID-XrWorldMeshGetInfoML-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrWorldMeshGetInfoML struct \"next\"",
                 &local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrWorldMeshGetInfoML : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"VUID-XrWorldMeshGetInfoML-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&world_mesh_detector_flags_ml_result,
                 "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshGetInfoML struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)&world_mesh_detector_flags_ml_result);
      std::__cxx11::string::~string((string *)&world_mesh_detector_flags_ml_result);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    VVar1 = ValidateXrWorldMeshDetectorFlagsML(value->flags);
    if (VVar1 == VALIDATE_XR_FLAGS_INVALID) {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,
                      "XrWorldMeshGetInfoML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_350);
      std::operator<<((ostream *)local_330,local_350);
      std::__cxx11::string::~string(local_350);
      std::operator<<((ostream *)local_330," contains illegal bit");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,"VUID-XrWorldMeshGetInfoML-flags-parameter",&local_371)
      ;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_390,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_370,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_390,local_3b0);
      std::__cxx11::string::~string((string *)local_3b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_390);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
    else {
      if ((value->blockCount == 0) && (value->blocks != (XrWorldMeshBlockRequestML *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3d0,"VUID-XrWorldMeshGetInfoML-blockCount-arraylength",&local_3d1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3f0,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_410,
                   "Structure XrWorldMeshGetInfoML member blockCount is non-optional and must be greater than 0"
                   ,&local_411);
        CoreValidLogMessage(instance_info,(string *)local_3d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_3f0,(string *)local_410);
        std::__cxx11::string::~string(local_410);
        std::allocator<char>::~allocator((allocator<char> *)&local_411);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3f0);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
      if ((value->blocks == (XrWorldMeshBlockRequestML *)0x0) && (value->blockCount != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_438,"VUID-XrWorldMeshGetInfoML-blocks-parameter",&local_439);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_458,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&value_blocks_inc,
                   "XrWorldMeshGetInfoML contains invalid NULL for XrWorldMeshBlockRequestML \"blocks\" is which not optional since \"blockCount\" is set and must be non-NULL"
                   ,&local_479);
        CoreValidLogMessage(instance_info,(string *)local_438,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_458,(string *)&value_blocks_inc);
        std::__cxx11::string::~string((string *)&value_blocks_inc);
        std::allocator<char>::~allocator((allocator<char> *)&local_479);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_458);
        std::__cxx11::string::~string(local_438);
        std::allocator<char>::~allocator((allocator<char> *)&local_439);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
      else {
        if (value->blocks != (XrWorldMeshBlockRequestML *)0x0) {
          for (local_480 = 0; local_480 < value->blockCount; local_480 = local_480 + 1) {
            XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                     value->blocks + local_480);
            if (XVar2 != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4a0,"VUID-XrWorldMeshGetInfoML-blocks-parameter",&local_4a1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_4c0,objects_info);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4e0,"Structure XrWorldMeshGetInfoML member blocks is invalid",
                         &local_4e1);
              CoreValidLogMessage(instance_info,(string *)local_4a0,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_4c0,(string *)local_4e0);
              std::__cxx11::string::~string(local_4e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_4c0);
              std::__cxx11::string::~string(local_4a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
              return XVar2;
            }
            valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
          }
        }
        instance_info_local._4_4_ =
             valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrWorldMeshGetInfoML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_WORLD_MESH_GET_INFO_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrWorldMeshGetInfoML",
                             value->type, "VUID-XrWorldMeshGetInfoML-type-type", XR_TYPE_WORLD_MESH_GET_INFO_ML, "XR_TYPE_WORLD_MESH_GET_INFO_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshGetInfoML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrWorldMeshGetInfoML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrWorldMeshGetInfoML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshGetInfoML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshGetInfoML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult world_mesh_detector_flags_ml_result = ValidateXrWorldMeshDetectorFlagsML(value->flags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == world_mesh_detector_flags_ml_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshGetInfoML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->flags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshGetInfoML-flags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->blockCount && nullptr != value->blocks) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshGetInfoML-blockCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshGetInfoML member blockCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->blocks && 0 != value->blockCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshGetInfoML-blocks-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshGetInfoML contains invalid NULL for XrWorldMeshBlockRequestML \"blocks\" is which not "
                            "optional since \"blockCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->blocks) {
        for (uint32_t value_blocks_inc = 0; value_blocks_inc < value->blockCount; ++value_blocks_inc) {
            // Validate that the structure XrWorldMeshBlockRequestML is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->blocks[value_blocks_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrWorldMeshGetInfoML-blocks-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrWorldMeshGetInfoML member blocks is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}